

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

ssize_t __thiscall
MT32Emu::MemoryRegion::read(MemoryRegion *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  Bit8u *pBVar2;
  void *pvVar3;
  uint in_R8D;
  Bit8u *src;
  uint len_local;
  Bit8u *dst_local;
  uint off_local;
  uint entry_local;
  MemoryRegion *this_local;
  
  uVar1 = __fd * this->entrySize + (int)__buf;
  pvVar3 = (void *)(ulong)uVar1;
  if (uVar1 <= this->entrySize * this->entries - 1) {
    src._4_4_ = in_R8D;
    if (this->entrySize * this->entries < uVar1 + in_R8D) {
      src._4_4_ = this->entrySize * this->entries - uVar1;
    }
    pBVar2 = getRealMemory(this);
    if (pBVar2 == (Bit8u *)0x0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = memcpy((void *)__nbytes,pBVar2 + uVar1,(ulong)src._4_4_);
    }
  }
  return (ssize_t)pvVar3;
}

Assistant:

void MemoryRegion::read(unsigned int entry, unsigned int off, Bit8u *dst, unsigned int len) const {
	off += entry * entrySize;
	// This method should never be called with out-of-bounds parameters,
	// or on an unsupported region - seeing any of this debug output indicates a bug in the emulator
	if (off > entrySize * entries - 1) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("read[%d]: parameters start out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}
	if (off + len > entrySize * entries) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("read[%d]: parameters end out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		len = entrySize * entries - off;
	}
	Bit8u *src = getRealMemory();
	if (src == NULL) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("read[%d]: unreadable region: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}
	memcpy(dst, src + off, len);
}